

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O2

ShaderVariableVkImpl * __thiscall
Diligent::ShaderVariableManagerVk::GetVariable(ShaderVariableManagerVk *this,Char *Name)

{
  ShaderVariableVkImpl *pSVar1;
  long lVar2;
  int iVar3;
  PipelineResourceDesc *pPVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = 0xffffffffffffffff;
  lVar2 = -0x18;
  do {
    lVar5 = lVar2;
    uVar6 = uVar6 + 1;
    if (this->m_NumVariables <= uVar6) {
      return (ShaderVariableVkImpl *)0x0;
    }
    pSVar1 = (this->
             super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
             ).m_pVariables;
    pPVar4 = ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
             ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                        *)((long)&pSVar1[1].
                                  super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                                  .super_IShaderResourceVariable.super_IObject._vptr_IObject + lVar5
                          ));
    iVar3 = strcmp(pPVar4->Name,Name);
    lVar2 = lVar5 + 0x18;
  } while (iVar3 != 0);
  return (ShaderVariableVkImpl *)
         ((long)&pSVar1[1].
                 super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                 .super_IShaderResourceVariable.super_IObject._vptr_IObject + lVar5);
}

Assistant:

ShaderVariableVkImpl* ShaderVariableManagerVk::GetVariable(const Char* Name) const
{
    for (Uint32 v = 0; v < m_NumVariables; ++v)
    {
        ShaderVariableVkImpl& Var = m_pVariables[v];
        if (strcmp(Var.GetDesc().Name, Name) == 0)
            return &Var;
    }
    return nullptr;
}